

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O2

void __thiscall OpenMD::ElementsTable::~ElementsTable(ElementsTable *this)

{
  Element *this_00;
  pointer ppEVar1;
  
  for (ppEVar1 = (this->elements_).
                 super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppEVar1 !=
      (this->elements_).super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppEVar1 = ppEVar1 + 1) {
    this_00 = *ppEVar1;
    if (this_00 != (Element *)0x0) {
      Element::~Element(this_00);
    }
    operator_delete(this_00,0xa0);
  }
  std::_Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::~_Vector_base
            (&(this->elements_).
              super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>);
  std::__cxx11::string::~string((string *)&this->envvar_);
  std::__cxx11::string::~string((string *)&this->subdir_);
  std::__cxx11::string::~string((string *)&this->dir_);
  std::__cxx11::string::~string((string *)&this->filename_);
  return;
}

Assistant:

ElementsTable::~ElementsTable() {
    std::vector<Element*>::iterator i;
    for (i = elements_.begin(); i != elements_.end(); ++i)
      delete *i;
  }